

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O3

void __thiscall
ClownLZSS::Internal::BitField::
WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
::Flush(WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        *this)

{
  if (this->bits_remaining != 8) {
    this->bits = this->bits >> ((byte)this->bits_remaining & 0x3f);
    std::ostream::put((char)(this->output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    this->bits_remaining = 8;
  }
  return;
}

Assistant:

void Flush()
				{
					if (bits_remaining != total_bits)
					{
						if constexpr(push_where == PushWhere::High)
							bits >>= bits_remaining;
						else //if constexpr(push_where == PushWhere::Low)
							bits <<= bits_remaining;

						WriteBitsImplementation();
					}
				}